

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O1

nva_card * nva_init_platform(void)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  FILE *__stream;
  char *pcVar4;
  nva_card *__ptr;
  uint32_t *puVar5;
  void *pvVar6;
  bool bVar7;
  uint32_t tmp;
  char path [4096];
  uint local_1140;
  uint local_113c;
  char local_1138 [256];
  char local_1038 [4104];
  
  __dirp = opendir("/sys/bus/platform/devices");
  if (__dirp != (DIR *)0x0) {
    local_1140 = 0xffffffff;
    do {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) break;
      pcVar4 = pdVar2->d_name;
      sVar3 = strlen(pcVar4);
      iVar1 = strcmp(pdVar2->d_name + (sVar3 - 4),".gpu");
      bVar7 = false;
      if ((iVar1 == 0) &&
         (iVar1 = __isoc99_sscanf(pcVar4,"%x.gpu",&local_113c), bVar7 = false, iVar1 == 1)) {
        bVar7 = false;
        memset(local_1138,0,0xff);
        snprintf(local_1038,0x1000,"%s/%s/modalias","/sys/bus/platform/devices",pcVar4);
        __stream = fopen(local_1038,"r");
        if (__stream != (FILE *)0x0) {
          fread(local_1138,1,0xff,__stream);
          fclose(__stream);
          pcVar4 = strstr(local_1138,"nvidia");
          bVar7 = pcVar4 != (char *)0x0;
        }
        if (bVar7) {
          local_1140 = local_113c;
        }
      }
    } while (!bVar7);
    closedir(__dirp);
    if ((local_1140 != 0xffffffff) && (__ptr = (nva_card *)calloc(0x90,1), __ptr != (nva_card *)0x0)
       ) {
      __ptr->type = NVA_DEVICE_GPU;
      __ptr->bus_type = NVA_BUS_PLATFORM;
      (__ptr->bus).platform_address = local_1140;
      iVar1 = open("/dev/mem",0x101002);
      if (iVar1 == -1) {
        nva_init_platform_cold_1();
      }
      else {
        puVar5 = (uint32_t *)mmap((void *)0x0,0x1000000,3,1,iVar1,(ulong)local_1140);
        __ptr->bar0 = puVar5;
        if (puVar5 != (uint32_t *)0x0) {
          __ptr->bar0len = 0x1000000;
          parse_pmc_id(*puVar5,&__ptr->chipset);
          if ((__ptr->chipset).chipset != 0xea) {
            return __ptr;
          }
          __ptr->hasbar1 = 1;
          __ptr->bar1len = 0x1000000;
          pvVar6 = mmap((void *)0x0,0x1000000,3,1,iVar1,0x58000000);
          __ptr->bar1 = pvVar6;
          return __ptr;
        }
        fprintf(_stderr,"WARN: Can\'t map the physical address 0x%x\n",(ulong)local_1140);
        free(__ptr);
      }
    }
  }
  return (nva_card *)0x0;
}

Assistant:

struct nva_card *nva_init_platform() {
	uint32_t tmp, bar0 = 0xffffffff;
	struct nva_card *card;
	struct dirent *dent;
	DIR *dir;
	int fd;

	/* Look for a gpu on the "platform" bus by looking at the platform bus,
	 * looking for an entry such as '/sys/bus/platform/devices/57000000.gpu'.
	 * We only expect up to one entry. This will not pick up the GPUs older
	 * than the tk1 because there was no "gpu" node before that, only gr2d
	 * and gr3d.
	 */
	if (!(dir = opendir(PLATFORM_DEVICES_DIR)))
		return NULL;
	while ((dent = readdir(dir))) {
		/* FIXME: this may not work on downstream kernels */
		const char *last_four = dent->d_name + strlen(dent->d_name) - 4;
		if (strcmp(last_four, ".gpu") == 0) {
			if (sscanf(dent->d_name, "%x.gpu", &tmp) == 1) {
				/* Check if the modalias contains nvidia */
				if (check_modalias(dent->d_name))
					continue;

				/* We have found the gpu, exit the loop */
				bar0 = tmp;
				break;
			}
		}
	}
	closedir(dir);

	if (bar0 == 0xffffffff)
		return NULL;

	/* we have found a gpu */
	card = calloc(sizeof *card, 1);
	if (!card)
                return 0;
	card->type = NVA_DEVICE_GPU;
	card->bus_type = NVA_BUS_PLATFORM;
	card->bus.platform_address = bar0;

	if((fd = open("/dev/mem", O_RDWR | O_SYNC)) == -1) {
		fprintf (stderr, "WARN: Can't open /dev/mem. Are you root?\n");
		free(card);
		return 0;
	}

	card->bar0 = mmap(0, 0x1000000, PROT_READ | PROT_WRITE, MAP_SHARED, fd, bar0);
	if (!card->bar0) {
		fprintf (stderr, "WARN: Can't map the physical address 0x%x\n", bar0);
		free(card);
		return 0;
	}
	card->bar0len = 0x1000000;

	uint32_t pmc_id = nva_grd32(card->bar0, 0);
	parse_pmc_id(pmc_id, &card->chipset);

	/* Enable bar1 for the devices we know because I cannot figure out how
	 * to read the relevant part of the DT via sysfs...
	 */
	if (card->chipset.chipset == 0xea) {
		card->hasbar1 = 1;
		card->bar1len = 0x1000000;
		card->bar1 = mmap(0, 0x1000000, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0x58000000);
	}

	return card;
}